

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFF_Layer3Transponder.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::IFF_Layer3Transponder::IFF_Layer3Transponder
          (IFF_Layer3Transponder *this,SimulationIdentifier *ReportingSimulation,
          Mode5TransponderBasicData *Data,
          vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
          *Records)

{
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
  *Records_local;
  Mode5TransponderBasicData *Data_local;
  SimulationIdentifier *ReportingSimulation_local;
  IFF_Layer3Transponder *this_local;
  
  IFF_Layer3::IFF_Layer3(&this->super_IFF_Layer3);
  (this->super_IFF_Layer3).super_LayerHeader.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__IFF_Layer3Transponder_00332e58;
  Mode5TransponderBasicData::Mode5TransponderBasicData(&this->m_BasicData);
  SimulationIdentifier::operator=(&(this->super_IFF_Layer3).m_RptSim,ReportingSimulation);
  Mode5TransponderBasicData::operator=(&this->m_BasicData,Data);
  IFF_Layer3::SetDataRecords(&this->super_IFF_Layer3,Records);
  return;
}

Assistant:

IFF_Layer3Transponder::IFF_Layer3Transponder( const SimulationIdentifier & ReportingSimulation, const Mode5TransponderBasicData & Data,
                                              std::vector<StdVarPtr> & Records ) 
{
    m_RptSim = ReportingSimulation;
    m_BasicData = Data;
    SetDataRecords( Records );
}